

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-header.h
# Opt level: O0

void __thiscall mp::NLInfo::NLInfo(NLInfo *this)

{
  iterator __result;
  long *in_RDI;
  array<long,_3UL> opt_default;
  long *in_stack_ffffffffffffffd0;
  long *__last;
  long *__first;
  
  *(undefined4 *)in_RDI = 1;
  in_RDI[0xb] = (long)"nl_instance";
  *(undefined4 *)((long)in_RDI + 4) = 3;
  in_RDI[10] = 0;
  *(undefined4 *)(in_RDI + 0xc) = 1;
  *(undefined4 *)((long)in_RDI + 100) = 1;
  std::fill<long*,int>(in_stack_ffffffffffffffd0,in_RDI,(int *)0x10c2b1);
  __last = (long *)0x1;
  __first = (long *)0x1;
  __result = std::array<long,_3UL>::begin((array<long,_3UL> *)0x10c2df);
  std::array<long,_3UL>::end((array<long,_3UL> *)0x10c2ee);
  std::copy<long*,long*>(__first,__last,__result);
  return;
}

Assistant:

NLInfo() {
    format = BINARY;
    prob_name = "nl_instance";
    num_ampl_options = 3;
    ampl_vbtol = 0.0;
    arith_kind = NL_ARITH_IEEE_LITTLE_ENDIAN;
    flags = WANT_OUTPUT_SUFFIXES;
    std::fill(ampl_options, ampl_options + MAX_AMPL_OPTIONS, 0);
    std::array<long, 3> opt_default {1, 1, 0};
    std::copy(opt_default.begin(), opt_default.end(), ampl_options);
  }